

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::parseRegExpGroup(Lexer *this)

{
  uint uVar1;
  bool bVar2;
  
  nextChar(this,true);
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  this->numberValue_ = 0;
  while( true ) {
    bVar2 = eof(this);
    if ((bVar2) || (uVar1 = this->currentChar_ - 0x30, 9 < uVar1)) break;
    this->numberValue_ = (ulong)uVar1 + this->numberValue_ * 10;
    std::__cxx11::string::push_back((char)this + -0x58);
    nextChar(this,true);
  }
  return RegExpGroup;
}

Assistant:

Token Lexer::parseRegExpGroup() {
  nextChar(); // skip leading '$'

  stringValue_.clear();
  numberValue_ = 0;

  while (!eof() && std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  return Token::RegExpGroup;
}